

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CY.cpp
# Opt level: O3

void __thiscall
qclab::qgates::CY<std::complex<double>_>::apply
          (CY<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_40_3_96b6a9c1 f;
  int *local_70 [2];
  long local_60;
  anon_class_40_3_96b6a9c1 local_58;
  
  (*(this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject[5])(local_70,this);
  *(ulong *)local_70[0] =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)local_70[0] >> 0x20),
                offset + (int)*(undefined8 *)local_70[0]);
  iVar1 = (this->super_QControlledGate2<std::complex<double>_>).control_;
  iVar2 = (*(this->super_QControlledGate2<std::complex<double>_>).
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xf])(this);
  local_58.vector =
       (vector->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_58.lambda2._M_value._8_8_ = 0x3ff0000000000000;
  local_58.lambda1._M_value._8_8_ = 0xbff0000000000000;
  if (op == Trans) {
    local_58.lambda1._M_value._8_8_ = 0x3ff0000000000000;
    local_58.lambda2._M_value._8_8_ = 0xbff0000000000000;
  }
  local_58.lambda1._M_value._0_8_ = 0;
  local_58.lambda2._M_value._0_8_ = 0;
  apply4<qclab::qgates::lambda_PauliY<std::complex<double>>(qclab::Op,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_70[0],local_70[0][1],iVar1 + offset,iVar2 + offset,
             (this->super_QControlledGate2<std::complex<double>_>).controlState_,&local_58);
  if (local_70[0] != (int *)0x0) {
    operator_delete(local_70[0],local_60 - (long)local_70[0]);
  }
  return;
}

Assistant:

void CY< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                       const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_PauliY( op , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }